

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O3

void __thiscall
PersistentStorageJsonTestSuite_GetRegistrarNotEmpty_Test::TestBody
          (PersistentStorageJsonTestSuite_GetRegistrarNotEmpty_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  size_type sVar7;
  pointer pbVar8;
  Status SVar9;
  int iVar10;
  char *in_R9;
  bool bVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  RegistrarId newId;
  Registrar returnValue;
  PersistentStorageJson psj;
  allocator_type local_121;
  AssertHelper local_120;
  undefined8 *local_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  RegistrarId local_b8;
  RegistrarId local_b4;
  Registrar local_b0;
  PersistentStorageJson local_68;
  
  unlink("./tmp/test.tmp");
  lVar4 = (long)&local_b0 + 0x10;
  local_b0._0_8_ = lVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"./tmp/test.tmp","");
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&local_68,(string *)&local_b0);
  if (local_b0._0_8_ != lVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&local_68);
  local_110._M_dataplus._M_p._0_1_ = SVar9 == kSuccess;
  local_110._M_string_length = 0;
  if (SVar9 != kSuccess) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_110,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,299,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar7 = local_110._M_string_length;
    if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_110._M_string_length !=
          (undefined8 *)(local_110._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_110._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_b8);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_b4,0xffffffff);
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"0.0.0.1","");
  paVar2 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"dom1","");
  __l._M_len = 1;
  __l._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,__l,&local_121);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,&local_b4,&local_110,1,&local_d0);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&local_68,&local_b0,&local_b8);
  local_120.data_._0_1_ = (internal)(SVar9 == kSuccess);
  local_118 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  lVar5 = (long)&local_b0 + 0x18;
  if (local_b0.mAddr._M_dataplus._M_p != (pointer)lVar5) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_120.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_120,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.1\", 1, {\"dom1\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x12f,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_110._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_118;
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(puVar6);
  }
  local_110._M_dataplus._M_p._0_1_ = local_b8.mId == 0;
  local_110._M_string_length = 0;
  if (local_b8.mId != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_110,(AssertionResult *)"newId.mId == 0",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x130,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar7 = local_110._M_string_length;
    if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_110._M_string_length !=
          (undefined8 *)(local_110._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_110._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_b4,0xffffffff);
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"0.0.0.2","");
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"dom2","");
  __l_00._M_len = 1;
  __l_00._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,__l_00,&local_121);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,&local_b4,&local_110,2,&local_d0);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&local_68,&local_b0,&local_b8);
  local_120.data_._0_1_ = (internal)(SVar9 == kSuccess);
  local_118 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != (pointer)lVar5) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_120.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_120,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.2\", 2, {\"dom2\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x131,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_110._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_118;
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(puVar6);
  }
  local_110._M_dataplus._M_p._0_1_ = local_b8.mId == 1;
  local_110._M_string_length = 0;
  if (local_b8.mId != 1) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_110,(AssertionResult *)"newId.mId == 1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x132,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar7 = local_110._M_string_length;
    if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_110._M_string_length !=
          (undefined8 *)(local_110._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_110._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_b4,0xffffffff);
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"0.0.0.3","");
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"dom3","");
  __l_01._M_len = 1;
  __l_01._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,__l_01,&local_121);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,&local_b4,&local_110,3,&local_d0);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&local_68,&local_b0,&local_b8);
  local_120.data_._0_1_ = (internal)(SVar9 == kSuccess);
  local_118 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != (pointer)lVar5) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_120.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_120,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.3\", 3, {\"dom3\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x133,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_110._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_118;
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(puVar6);
  }
  local_110._M_dataplus._M_p._0_1_ = local_b8.mId == 2;
  local_110._M_string_length = 0;
  if (local_b8.mId != 2) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_110,(AssertionResult *)"newId.mId == 2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x134,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar7 = local_110._M_string_length;
    if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_110._M_string_length !=
          (undefined8 *)(local_110._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_110._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  ot::commissioner::persistent_storage::Registrar::Registrar(&local_b0);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId((RegistrarId *)&local_110,3);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&local_68,(RegistrarId *)&local_110,&local_b0);
  bVar11 = SVar9 == kNotFound;
  local_f0._M_string_length = 0;
  local_f0._M_dataplus._M_p._0_1_ = bVar11;
  if (!bVar11) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_f0,
               (AssertionResult *)
               "psj.Get(RegistrarId(3), returnValue) == PersistentStorage::Status::kNotFound",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x138,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
    sVar7 = local_f0._M_string_length;
    if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_f0._M_string_length !=
          (undefined8 *)(local_f0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_f0._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId((RegistrarId *)&local_110,1);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&local_68,(RegistrarId *)&local_110,&local_b0);
  local_f0._M_dataplus._M_p._0_1_ = SVar9 == kSuccess;
  local_f0._M_string_length = 0;
  if (!(bool)local_f0._M_dataplus._M_p._0_1_) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_f0,
               (AssertionResult *)
               "psj.Get(RegistrarId(1), returnValue) == PersistentStorage::Status::kSuccess","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x139,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
    sVar7 = local_f0._M_string_length;
    if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_f0._M_string_length !=
          (undefined8 *)(local_f0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_f0._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  local_f0._M_dataplus._M_p._0_1_ = local_b0.mId.mId == 1;
  local_f0._M_string_length = 0;
  if (!(bool)local_f0._M_dataplus._M_p._0_1_) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_f0,(AssertionResult *)"returnValue.mId.mId == 1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13a,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
    sVar7 = local_f0._M_string_length;
    if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_f0._M_string_length !=
          (undefined8 *)(local_f0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_f0._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  iVar10 = std::__cxx11::string::compare((char *)((long)&local_b0 + 8));
  local_f0._M_dataplus._M_p._0_1_ = iVar10 == 0;
  local_f0._M_string_length = 0;
  if (!(bool)local_f0._M_dataplus._M_p._0_1_) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_f0,
               (AssertionResult *)"returnValue.mAddr == \"0.0.0.2\"","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13b,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
    sVar7 = local_f0._M_string_length;
    if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_f0._M_string_length !=
          (undefined8 *)(local_f0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_f0._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  local_f0._M_dataplus._M_p._0_1_ = local_b0.mPort == 2;
  local_f0._M_string_length = 0;
  if (local_b0.mPort != 2) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_f0,(AssertionResult *)"returnValue.mPort == 2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13c,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
    sVar7 = local_f0._M_string_length;
    if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_f0._M_string_length !=
          (undefined8 *)(local_f0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_f0._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"dom2","");
  __l_02._M_len = 1;
  __l_02._M_array = &local_110;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_f0,__l_02,(allocator_type *)&local_120);
  if ((long)local_b0.mDomains.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_b0.mDomains.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      local_f0._M_string_length - (long)local_f0._M_dataplus._M_p) {
    local_d0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ =
         (internal)
         std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                   (local_b0.mDomains.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    local_b0.mDomains.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_f0._M_dataplus._M_p);
  }
  else {
    local_d0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)0x0;
  }
  local_d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_d0,
               (AssertionResult *)"returnValue.mDomains == std::vector<std::string>{\"dom2\"}",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13d,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_f0._M_dataplus._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
  }
  pbVar8 = local_d0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    pcVar3 = ((local_d0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 !=
        &(local_d0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->field_2) {
      operator_delete(pcVar3);
    }
    operator_delete(pbVar8);
  }
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&local_68);
  local_f0._M_dataplus._M_p._0_1_ = SVar9 == kSuccess;
  local_f0._M_string_length = 0;
  if (SVar9 != kSuccess) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_f0,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13f,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_d0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
    sVar7 = local_f0._M_string_length;
    if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_f0._M_string_length !=
          (undefined8 *)(local_f0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_f0._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != (pointer)lVar5) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&local_68);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetRegistrarNotEmpty)
{
    // Make test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    RegistrarId newId;

    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.1", 1, {"dom1"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.2", 2, {"dom2"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.3", 3, {"dom3"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    Registrar returnValue;

    EXPECT_TRUE(psj.Get(RegistrarId(3), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(RegistrarId(1), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 1);
    EXPECT_TRUE(returnValue.mAddr == "0.0.0.2");
    EXPECT_TRUE(returnValue.mPort == 2);
    EXPECT_TRUE(returnValue.mDomains == std::vector<std::string>{"dom2"});

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}